

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O2

void __thiscall
LinkedObjectFile::push_back_word_to_segment(LinkedObjectFile *this,uint32_t word,int segment)

{
  vector<LinkedWord,std::allocator<LinkedWord>> *this_00;
  uint32_t local_c;
  
  local_c = word;
  this_00 = (vector<LinkedWord,std::allocator<LinkedWord>> *)
            std::
            vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
            ::at(&this->words_by_seg,(long)segment);
  std::vector<LinkedWord,std::allocator<LinkedWord>>::emplace_back<unsigned_int&>(this_00,&local_c);
  return;
}

Assistant:

void LinkedObjectFile::push_back_word_to_segment(uint32_t word, int segment) {
  words_by_seg.at(segment).emplace_back(word);
}